

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O2

void __thiscall
gimage::PNGImageIO::loadHeader(PNGImageIO *this,char *name,long *width,long *height,int *depth)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  __jmp_buf_tag *__env;
  IOException *pIVar4;
  png_structp png;
  png_infop info;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  png_infop end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar2 == '\0') {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_50,name,(allocator *)&png);
    std::operator+(&local_70,"Can only load PNG image (",&local_50);
    std::operator+(&local_98,&local_70,")");
    gutil::IOException::IOException(pIVar4,&local_98);
    __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_50,name,(allocator *)&png);
    std::operator+(&local_70,"Cannot open file (",&local_50);
    std::operator+(&local_98,&local_70,")");
    gutil::IOException::IOException(pIVar4,&local_98);
    __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png = (png_structp)png_create_read_struct("1.6.37",0,0);
  if (png == (png_structp)0x0) {
    fclose(__stream);
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_98,"Cannot allocate handle for reading PNG files",
               (allocator *)&local_70);
    gutil::IOException::IOException(pIVar4,&local_98);
    __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  info = (png_infop)png_create_info_struct(png);
  if (info != (png_infop)0x0) {
    end = (png_infop)png_create_info_struct(png);
    if (end == (png_infop)0x0) {
      png_destroy_read_struct(&png,&info,0);
      fclose(__stream);
      pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_98,"Cannot allocate PNG info structure",(allocator *)&local_70);
      gutil::IOException::IOException(pIVar4,&local_98);
      __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 == 0) {
      png_init_io(png,__stream);
      png_read_info(png,info);
      uVar3 = png_get_image_width(png,info);
      *width = (ulong)uVar3;
      uVar3 = png_get_image_height(png,info);
      *height = (ulong)uVar3;
      *depth = 1;
      bVar1 = png_get_color_type(png,info);
      if ((bVar1 < 7) && ((0x4cU >> (bVar1 & 0x1f) & 1) != 0)) {
        *depth = 3;
      }
      png_destroy_read_struct(&png,&info,&end);
      fclose(__stream);
      return;
    }
    png_destroy_read_struct(&png,&info,&end);
    fclose(__stream);
    pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_50,name,&local_99);
    std::operator+(&local_70,"Cannot read PNG file (",&local_50);
    std::operator+(&local_98,&local_70,")");
    gutil::IOException::IOException(pIVar4,&local_98);
    __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png_destroy_read_struct(&png,0);
  fclose(__stream);
  pIVar4 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_98,"Cannot allocate PNG info structure",(allocator *)&local_70);
  gutil::IOException::IOException(pIVar4,&local_98);
  __cxa_throw(pIVar4,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNGImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  if (setjmp(png_jmpbuf(png)))
  {
    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  width=static_cast<long>(png_get_image_width(png, info));
  height=static_cast<long>(png_get_image_height(png, info));

  depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // close data set

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}